

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# marshal.c
# Opt level: O2

ptrlen BinarySource_get_pstring(BinarySource *src)

{
  size_t sVar1;
  _Bool _Var2;
  char *pcVar3;
  ulong wanted;
  ptrlen pVar4;
  
  _Var2 = BinarySource_data_avail(src,1);
  pcVar3 = anon_var_dwarf_3291b + 10;
  if (_Var2) {
    sVar1 = src->pos;
    src->pos = sVar1 + 1;
    wanted = (ulong)*(byte *)((long)src->data + sVar1);
    _Var2 = BinarySource_data_avail(src,wanted);
    if (_Var2) {
      sVar1 = src->pos;
      src->pos = sVar1 + wanted;
      pcVar3 = (char *)(sVar1 + (long)src->data);
      goto LAB_00162eb8;
    }
  }
  wanted = 0;
LAB_00162eb8:
  pVar4.len = wanted;
  pVar4.ptr = pcVar3;
  return pVar4;
}

Assistant:

ptrlen BinarySource_get_pstring(BinarySource *src)
{
    const unsigned char *ucp;
    size_t len;

    if (!avail(1))
        return make_ptrlen("", 0);

    ucp = consume(1);
    len = *ucp;

    if (!avail(len))
        return make_ptrlen("", 0);

    return make_ptrlen(consume(len), len);
}